

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::LoadFromRuleTSV
          (SentencePieceNormalizer *this,string_view filename)

{
  ModelProto *this_00;
  NormalizerSpec *pNVar1;
  ulong uVar2;
  Arena *pAVar3;
  __single_object model_proto;
  _Head_base<0UL,_sentencepiece::ModelProto_*,_false> local_60;
  __uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
  local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = (ModelProto *)operator_new(0x68);
  sentencepiece::ModelProto::ModelProto(this_00,(Arena *)0x0);
  this_00[0x28] = (ModelProto)((byte)this_00[0x28] | 2);
  local_60._M_head_impl = this_00;
  if (*(long *)(this_00 + 0x50) == 0) {
    pAVar3 = *(Arena **)(this_00 + 8);
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    pNVar1 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(pAVar3);
    *(NormalizerSpec **)(this_00 + 0x50) = pNVar1;
  }
  pNVar1 = *(NormalizerSpec **)(this_00 + 0x50);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50);
  pNVar1[0x28] = (NormalizerSpec)((byte)pNVar1[0x28] | 4);
  uVar2 = *(ulong *)(pNVar1 + 8);
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set(pNVar1 + 0x40,local_50,uVar2);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  SentencePieceTrainer::PopulateNormalizerSpec((SentencePieceTrainer *)this,pNVar1,false);
  if (this->_vptr_SentencePieceNormalizer == (_func_int **)0x0) {
    sentencepiece::util::Status::~Status((Status *)this);
    local_58._M_t.
    super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
    .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         local_60._M_head_impl;
    local_60._M_head_impl = (ModelProto *)0x0;
    (**(code **)(*(long *)filename._M_len + 0x10))(this,(long *)filename._M_len);
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                 *)&local_58);
  }
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
               *)&local_60);
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::LoadFromRuleTSV(
    absl::string_view filename) {
  auto model_proto = std::make_unique<ModelProto>();
  auto *spec = model_proto->mutable_normalizer_spec();
  spec->set_normalization_rule_tsv(std::string(filename));
  RETURN_IF_ERROR(SentencePieceTrainer::PopulateNormalizerSpec(spec));
  return Load(std::move(model_proto));
}